

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError parse_url(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  _Bool _Var1;
  int iVar2;
  char *thisurl;
  char *ptr;
  FILE *f;
  undefined1 local_48 [2];
  _Bool fromstdin;
  _Bool error;
  ParameterError err;
  dynbuf line;
  char *nextarg_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  
  line.toobig = (size_t)nextarg;
  if ((nextarg == (char *)0x0) || (*nextarg != '@')) {
    global_local._4_4_ = add_url(global,config,nextarg,0);
  }
  else {
    f._4_4_ = PARAM_OK;
    f._3_1_ = 0;
    iVar2 = strcmp("-",nextarg + 1);
    f._2_1_ = (iVar2 != 0 ^ 0xffU) & 1;
    if (f._2_1_ == 0) {
      ptr = (char *)fopen64((char *)(line.toobig + 1),"r");
    }
    else {
      ptr = _stdin;
    }
    if (ptr == (char *)0x0) {
      global_local._4_4_ = PARAM_READ_ERROR;
    }
    else {
      curlx_dyn_init((dynbuf *)local_48,0x1f9c);
      do {
        _Var1 = my_get_line((FILE *)ptr,(dynbuf *)local_48,(_Bool *)((long)&f + 3));
        if (!_Var1) break;
        thisurl = curlx_dyn_ptr((dynbuf *)local_48);
        f._4_4_ = add_url(global,config,thisurl,0x24);
      } while (f._4_4_ == PARAM_OK);
      if ((f._2_1_ & 1) == 0) {
        fclose((FILE *)ptr);
      }
      curlx_dyn_free((dynbuf *)local_48);
      if (((f._3_1_ & 1) == 0) && (f._4_4_ == PARAM_OK)) {
        global_local._4_4_ = PARAM_OK;
      }
      else {
        global_local._4_4_ = PARAM_READ_ERROR;
      }
    }
  }
  return global_local._4_4_;
}

Assistant:

static ParameterError parse_url(struct GlobalConfig *global,
                                struct OperationConfig *config,
                                const char *nextarg)
{
  if(nextarg && (nextarg[0] == '@')) {
    /* read URLs from a file, treat all as -O */
    struct curlx_dynbuf line;
    ParameterError err = PARAM_OK;
    bool error = FALSE;
    bool fromstdin = !strcmp("-", &nextarg[1]);
    FILE *f;

    if(fromstdin)
      f = stdin;
    else
      f = fopen(&nextarg[1], FOPEN_READTEXT);
    if(f) {
      curlx_dyn_init(&line, 8092);
      while(my_get_line(f, &line, &error)) {
        const char *ptr = curlx_dyn_ptr(&line);
        err = add_url(global, config, ptr, GETOUT_USEREMOTE | GETOUT_NOGLOB);
        if(err)
          break;
      }
      if(!fromstdin)
        fclose(f);
      curlx_dyn_free(&line);
      if(error || err)
        return PARAM_READ_ERROR;
      return PARAM_OK;
    }
    return PARAM_READ_ERROR; /* file not found */
  }
  return add_url(global, config, nextarg, 0);
}